

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O0

void opj_copy_image_header(opj_image_t *p_image_src,opj_image_t *p_image_dest)

{
  opj_image_comp_t *poVar1;
  OPJ_BYTE *pOVar2;
  opj_image_comp_t *image_comp;
  OPJ_UINT32 compno;
  opj_image_t *p_image_dest_local;
  opj_image_t *p_image_src_local;
  
  if (p_image_src == (opj_image_t *)0x0) {
    __assert_fail("p_image_src != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/image.c"
                  ,0xab,"void opj_copy_image_header(const opj_image_t *, opj_image_t *)");
  }
  if (p_image_dest != (opj_image_t *)0x0) {
    p_image_dest->x0 = p_image_src->x0;
    p_image_dest->y0 = p_image_src->y0;
    p_image_dest->x1 = p_image_src->x1;
    p_image_dest->y1 = p_image_src->y1;
    if (p_image_dest->comps != (opj_image_comp_t *)0x0) {
      for (image_comp._4_4_ = 0; image_comp._4_4_ < p_image_dest->numcomps;
          image_comp._4_4_ = image_comp._4_4_ + 1) {
        if (p_image_dest->comps[image_comp._4_4_].data != (OPJ_INT32 *)0x0) {
          opj_image_data_free(p_image_dest->comps[image_comp._4_4_].data);
        }
      }
      opj_free(p_image_dest->comps);
      p_image_dest->comps = (opj_image_comp_t *)0x0;
    }
    p_image_dest->numcomps = p_image_src->numcomps;
    poVar1 = (opj_image_comp_t *)opj_malloc((ulong)p_image_dest->numcomps << 6);
    p_image_dest->comps = poVar1;
    if (p_image_dest->comps == (opj_image_comp_t *)0x0) {
      p_image_dest->comps = (opj_image_comp_t *)0x0;
      p_image_dest->numcomps = 0;
    }
    else {
      for (image_comp._4_4_ = 0; image_comp._4_4_ < p_image_dest->numcomps;
          image_comp._4_4_ = image_comp._4_4_ + 1) {
        memcpy(p_image_dest->comps + image_comp._4_4_,p_image_src->comps + image_comp._4_4_,0x40);
        p_image_dest->comps[image_comp._4_4_].data = (OPJ_INT32 *)0x0;
      }
      p_image_dest->color_space = p_image_src->color_space;
      p_image_dest->icc_profile_len = p_image_src->icc_profile_len;
      if (p_image_dest->icc_profile_len == 0) {
        p_image_dest->icc_profile_buf = (OPJ_BYTE *)0x0;
      }
      else {
        pOVar2 = (OPJ_BYTE *)opj_malloc((ulong)p_image_dest->icc_profile_len);
        p_image_dest->icc_profile_buf = pOVar2;
        if (p_image_dest->icc_profile_buf == (OPJ_BYTE *)0x0) {
          p_image_dest->icc_profile_buf = (OPJ_BYTE *)0x0;
          p_image_dest->icc_profile_len = 0;
        }
        else {
          memcpy(p_image_dest->icc_profile_buf,p_image_src->icc_profile_buf,
                 (ulong)p_image_src->icc_profile_len);
        }
      }
    }
    return;
  }
  __assert_fail("p_image_dest != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/image.c"
                ,0xac,"void opj_copy_image_header(const opj_image_t *, opj_image_t *)");
}

Assistant:

void opj_copy_image_header(const opj_image_t* p_image_src,
                           opj_image_t* p_image_dest)
{
    OPJ_UINT32 compno;

    /* preconditions */
    assert(p_image_src != 00);
    assert(p_image_dest != 00);

    p_image_dest->x0 = p_image_src->x0;
    p_image_dest->y0 = p_image_src->y0;
    p_image_dest->x1 = p_image_src->x1;
    p_image_dest->y1 = p_image_src->y1;

    if (p_image_dest->comps) {
        for (compno = 0; compno < p_image_dest->numcomps; compno++) {
            opj_image_comp_t *image_comp = &(p_image_dest->comps[compno]);
            if (image_comp->data) {
                opj_image_data_free(image_comp->data);
            }
        }
        opj_free(p_image_dest->comps);
        p_image_dest->comps = NULL;
    }

    p_image_dest->numcomps = p_image_src->numcomps;

    p_image_dest->comps = (opj_image_comp_t*) opj_malloc(p_image_dest->numcomps *
                          sizeof(opj_image_comp_t));
    if (!p_image_dest->comps) {
        p_image_dest->comps = NULL;
        p_image_dest->numcomps = 0;
        return;
    }

    for (compno = 0; compno < p_image_dest->numcomps; compno++) {
        memcpy(&(p_image_dest->comps[compno]),
               &(p_image_src->comps[compno]),
               sizeof(opj_image_comp_t));
        p_image_dest->comps[compno].data = NULL;
    }

    p_image_dest->color_space = p_image_src->color_space;
    p_image_dest->icc_profile_len = p_image_src->icc_profile_len;

    if (p_image_dest->icc_profile_len) {
        p_image_dest->icc_profile_buf = (OPJ_BYTE*)opj_malloc(
                                            p_image_dest->icc_profile_len);
        if (!p_image_dest->icc_profile_buf) {
            p_image_dest->icc_profile_buf = NULL;
            p_image_dest->icc_profile_len = 0;
            return;
        }
        memcpy(p_image_dest->icc_profile_buf,
               p_image_src->icc_profile_buf,
               p_image_src->icc_profile_len);
    } else {
        p_image_dest->icc_profile_buf = NULL;
    }

    return;
}